

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TIntermediate::foldDereference
          (TIntermediate *this,TIntermTyped *node,int index,TSourceLoc *loc)

{
  char cVar1;
  int iVar2;
  int size;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermConstantUnion *pTVar5;
  long lVar6;
  TType dereferencedType;
  TConstUnionArray local_d8;
  TType local_c8;
  undefined4 extraout_var_01;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  TType::TType(&local_c8,(TType *)CONCAT44(extraout_var,iVar2),index,false);
  local_c8.qualifier._8_8_ = local_c8.qualifier._8_8_ & 0xffffffffffffff80 | 2;
  size = TType::computeNumComponents(&local_c8);
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  iVar2 = 0;
  if ((*(byte *)(CONCAT44(extraout_var_00,iVar3) + 10) & 0x60) == 0) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])(node);
    if (((char)iVar2 == '\0') &&
       (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])(node), (char)iVar2 != '\0')) {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])(node);
      if ((char)iVar2 == '\0') {
        __assert_fail("node->isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x4dd,
                      "TIntermTyped *glslang::TIntermediate::foldDereference(TIntermTyped *, int, const TSourceLoc &)"
                     );
      }
      iVar2 = 0;
      if (0 < index) {
        lVar6 = 0;
        iVar2 = 0;
        do {
          iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
          plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
          cVar1 = (**(code **)(*plVar4 + 0x128))(plVar4);
          if (cVar1 == '\0') {
            __assert_fail("isStruct()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                          ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
          }
          iVar3 = TType::computeNumComponents(*(TType **)(*(long *)(plVar4[0xd] + 8) + lVar6));
          iVar2 = iVar2 + iVar3;
          lVar6 = lVar6 + 0x20;
        } while ((ulong)(uint)index << 5 != lVar6);
      }
    }
    else {
      iVar2 = index * size;
    }
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
  TConstUnionArray::TConstUnionArray
            (&local_d8,(TConstUnionArray *)(CONCAT44(extraout_var_02,iVar3) + 0xb8),iVar2,size);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  pTVar5 = addConstantUnion(this,&local_d8,(TType *)CONCAT44(extraout_var_03,iVar2),loc,false);
  if (pTVar5 != (TIntermConstantUnion *)0x0) {
    (*(pTVar5->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(pTVar5,&local_c8);
    node = &pTVar5->super_TIntermTyped;
  }
  return &((TIntermConstantUnion *)node)->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermediate::foldDereference(TIntermTyped* node, int index, const TSourceLoc& loc)
{
    TType dereferencedType(node->getType(), index);
    dereferencedType.getQualifier().storage = EvqConst;
    TIntermTyped* result = nullptr;
    int size = dereferencedType.computeNumComponents();

    // arrays, vectors, matrices, all use simple multiplicative math
    // while structures need to add up heterogeneous members
    int start;
    if (node->getType().isCoopMat())
        start = 0;
    else if (node->isArray() || ! node->isStruct())
        start = size * index;
    else {
        // it is a structure
        assert(node->isStruct());
        start = 0;
        for (int i = 0; i < index; ++i)
            start += (*node->getType().getStruct())[i].type->computeNumComponents();
    }

    result = addConstantUnion(TConstUnionArray(node->getAsConstantUnion()->getConstArray(), start, size), node->getType(), loc);

    if (result == nullptr)
        result = node;
    else
        result->setType(dereferencedType);

    return result;
}